

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::JsRTConstructCallAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  ScriptContext *scriptContext;
  JsRTConstructCallAction *pJVar5;
  RecyclableObject *pRVar6;
  Var pvVar7;
  JavascriptFunction *v;
  undefined4 *puVar8;
  uint32 i;
  ulong uVar9;
  Arguments local_50;
  EventLogEntry *local_40;
  Var local_38;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  local_40 = evt;
  pJVar5 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTConstructCallAction,(TTD::NSLogEvents::EventKind)66>
                     (evt);
  local_38 = InflateVarInReplay(executeContext,*pJVar5->ArgArray);
  if ((local_38 != (Var)0x0) && (bVar3 = Js::VarIs<Js::JavascriptFunction>(local_38), bVar3)) {
    pRVar6 = Js::VarTo<Js::RecyclableObject>(local_38);
    if ((((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext
        .ptr != scriptContext) {
      local_38 = Js::CrossSite::MarshalVar(scriptContext,pRVar6,false);
    }
    for (uVar9 = 1; uVar9 < pJVar5->ArgCount; uVar9 = uVar9 + 1) {
      pvVar7 = InflateVarInReplay(executeContext,pJVar5->ArgArray[uVar9]);
      if (pvVar7 == (Var)0x0) {
        return;
      }
      if (((ulong)pvVar7 >> 0x30 == 0) &&
         (pRVar6 = Js::VarTo<Js::RecyclableObject>(pvVar7),
         (((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
         scriptContext.ptr != scriptContext)) {
        pvVar7 = Js::CrossSite::MarshalVar(scriptContext,pRVar6,false);
      }
      pJVar5->ExecArgs[uVar9 - 1] = pvVar7;
    }
    v = Js::VarTo<Js::JavascriptFunction>(local_38);
    local_50.Info._0_4_ = pJVar5->ArgCount - 1 & 0xffff | 0x1000000;
    local_50.Info._4_4_ = 0;
    local_50.Values = pJVar5->ExecArgs;
    pTVar1 = scriptContext->threadContext;
    bVar3 = pTVar1->reentrancySafeOrHandled;
    pTVar1->reentrancySafeOrHandled = true;
    pvVar7 = Js::JavascriptFunction::CallAsConstructor
                       (v,(Var)0x0,&local_50,scriptContext,(AuxArray<unsigned_int> *)0x0);
    pTVar1->reentrancySafeOrHandled = bVar3;
    if ((pvVar7 != (Var)0x0) &&
       (BVar4 = Js::CrossSite::NeedMarshalVar(pvVar7,scriptContext), BVar4 != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                         ,0x369,"(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx))",
                         "res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTConstructCallAction,(TTD::NSLogEvents::EventKind)66>
              (executeContext,local_40,pvVar7);
  }
  return;
}

Assistant:

void JsRTConstructCallAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTConstructCallAction* ccAction = GetInlineEventDataAs<JsRTConstructCallAction, EventKind::ConstructCallActionTag>(evt);

            Js::Var jsFunctionVar = InflateVarInReplay(executeContext, ccAction->ArgArray[0]);
            TTD_REPLAY_VALIDATE_INCOMING_FUNCTION(jsFunctionVar, ctx);

            //remove implicit constructor function as first arg in callInfo and argument loop below
            for (uint32 i = 1; i < ccAction->ArgCount; ++i)
            {
                Js::Var argi = InflateVarInReplay(executeContext, ccAction->ArgArray[i]);
                TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(argi, ctx);

                ccAction->ExecArgs[i - 1] = argi;
            }

            Js::JavascriptFunction* jsFunction = Js::VarTo<Js::JavascriptFunction>(jsFunctionVar);
            Js::CallInfo callInfo(Js::CallFlags::CallFlags_New, (ushort)(ccAction->ArgCount - 1));
            Js::Arguments jsArgs(callInfo, ccAction->ExecArgs);

            //
            //TODO: we will want to look at this at some point -- either treat as "top-level" call or maybe constructors are fast so we can just jump back to previous "real" code
            //TTDAssert(!Js::VarIs<Js::ScriptFunction>(jsFunction) || execContext->GetThreadContext()->TTDRootNestingCount != 0, "This will cause user code to execute and we need to add support for that as a top-level call source!!!!");
            //

            Js::Var res = nullptr;
            BEGIN_SAFE_REENTRANT_CALL(ctx->GetThreadContext())
            {
                res = Js::JavascriptFunction::CallAsConstructor(jsFunction, /* overridingNewTarget = */nullptr, jsArgs, ctx);
            }
            END_SAFE_REENTRANT_CALL
            Assert(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx));

            JsRTActionHandleResultForReplay<JsRTConstructCallAction, EventKind::ConstructCallActionTag>(executeContext, evt, res);
        }